

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O2

void __thiscall irr::io::SNamedPath::setPath(SNamedPath *this,path *p)

{
  path pStack_38;
  
  core::string<char>::operator=(&this->Path,p);
  PathToName(&pStack_38,this,p);
  core::string<char>::operator=(&this->InternalName,&pStack_38);
  ::std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void setPath(const path &p)
	{
		Path = p;
		InternalName = PathToName(p);
	}